

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-ir.cc
# Opt level: O0

Result __thiscall
wabt::anon_unknown_67::BinaryReaderIR::OnExport
          (BinaryReaderIR *this,Index index,ExternalKind kind,Index item_index,string_view name)

{
  Module *this_00;
  Index index_00;
  pointer pEVar1;
  size_type sVar2;
  ulong uVar3;
  unique_ptr<wabt::ExportModuleField,_std::default_delete<wabt::ExportModuleField>_> local_108;
  Location local_100;
  Var local_e0;
  string local_88;
  string *local_68;
  Export *export_;
  unique_ptr<wabt::ExportModuleField,_std::default_delete<wabt::ExportModuleField>_> local_40;
  unique_ptr<wabt::ExportModuleField,_std::default_delete<wabt::ExportModuleField>_> field;
  Index item_index_local;
  ExternalKind kind_local;
  Index index_local;
  BinaryReaderIR *this_local;
  string_view name_local;
  
  name_local.data_ = (char *)name.size_;
  this_local = (BinaryReaderIR *)name.data_;
  field._M_t.
  super___uniq_ptr_impl<wabt::ExportModuleField,_std::default_delete<wabt::ExportModuleField>_>._M_t
  .super__Tuple_impl<0UL,_wabt::ExportModuleField_*,_std::default_delete<wabt::ExportModuleField>_>.
  super__Head_base<0UL,_wabt::ExportModuleField_*,_false>._M_head_impl._4_4_ = item_index;
  GetLocation((Location *)&export_,this);
  MakeUnique<wabt::ExportModuleField,wabt::Location>((wabt *)&local_40,(Location *)&export_);
  pEVar1 = std::unique_ptr<wabt::ExportModuleField,_std::default_delete<wabt::ExportModuleField>_>::
           operator->(&local_40);
  local_68 = (string *)&pEVar1->export_;
  string_view::to_string_abi_cxx11_(&local_88,(string_view *)&this_local);
  std::__cxx11::string::operator=(local_68,(string *)&local_88);
  std::__cxx11::string::~string((string *)&local_88);
  switch(kind) {
  case First:
    uVar3 = (ulong)field._M_t.
                   super___uniq_ptr_impl<wabt::ExportModuleField,_std::default_delete<wabt::ExportModuleField>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_wabt::ExportModuleField_*,_std::default_delete<wabt::ExportModuleField>_>
                   .super__Head_base<0UL,_wabt::ExportModuleField_*,_false>._M_head_impl._4_4_;
    sVar2 = std::vector<wabt::Func_*,_std::allocator<wabt::Func_*>_>::size(&this->module_->funcs);
    if (sVar2 <= uVar3) {
      __assert_fail("item_index < module_->funcs.size()",
                    "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/wabt/src/binary-reader-ir.cc"
                    ,0x220,
                    "virtual Result wabt::(anonymous namespace)::BinaryReaderIR::OnExport(Index, ExternalKind, Index, string_view)"
                   );
    }
    break;
  case Table:
    uVar3 = (ulong)field._M_t.
                   super___uniq_ptr_impl<wabt::ExportModuleField,_std::default_delete<wabt::ExportModuleField>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_wabt::ExportModuleField_*,_std::default_delete<wabt::ExportModuleField>_>
                   .super__Head_base<0UL,_wabt::ExportModuleField_*,_false>._M_head_impl._4_4_;
    sVar2 = std::vector<wabt::Table_*,_std::allocator<wabt::Table_*>_>::size(&this->module_->tables)
    ;
    if (sVar2 <= uVar3) {
      __assert_fail("item_index < module_->tables.size()",
                    "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/wabt/src/binary-reader-ir.cc"
                    ,0x223,
                    "virtual Result wabt::(anonymous namespace)::BinaryReaderIR::OnExport(Index, ExternalKind, Index, string_view)"
                   );
    }
    break;
  case Memory:
    uVar3 = (ulong)field._M_t.
                   super___uniq_ptr_impl<wabt::ExportModuleField,_std::default_delete<wabt::ExportModuleField>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_wabt::ExportModuleField_*,_std::default_delete<wabt::ExportModuleField>_>
                   .super__Head_base<0UL,_wabt::ExportModuleField_*,_false>._M_head_impl._4_4_;
    sVar2 = std::vector<wabt::Memory_*,_std::allocator<wabt::Memory_*>_>::size
                      (&this->module_->memories);
    if (sVar2 <= uVar3) {
      __assert_fail("item_index < module_->memories.size()",
                    "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/wabt/src/binary-reader-ir.cc"
                    ,0x226,
                    "virtual Result wabt::(anonymous namespace)::BinaryReaderIR::OnExport(Index, ExternalKind, Index, string_view)"
                   );
    }
    break;
  case Global:
    uVar3 = (ulong)field._M_t.
                   super___uniq_ptr_impl<wabt::ExportModuleField,_std::default_delete<wabt::ExportModuleField>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_wabt::ExportModuleField_*,_std::default_delete<wabt::ExportModuleField>_>
                   .super__Head_base<0UL,_wabt::ExportModuleField_*,_false>._M_head_impl._4_4_;
    sVar2 = std::vector<wabt::Global_*,_std::allocator<wabt::Global_*>_>::size
                      (&this->module_->globals);
    if (sVar2 <= uVar3) {
      __assert_fail("item_index < module_->globals.size()",
                    "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/wabt/src/binary-reader-ir.cc"
                    ,0x229,
                    "virtual Result wabt::(anonymous namespace)::BinaryReaderIR::OnExport(Index, ExternalKind, Index, string_view)"
                   );
    }
    break;
  case Except:
  }
  index_00 = field._M_t.
             super___uniq_ptr_impl<wabt::ExportModuleField,_std::default_delete<wabt::ExportModuleField>_>
             ._M_t.
             super__Tuple_impl<0UL,_wabt::ExportModuleField_*,_std::default_delete<wabt::ExportModuleField>_>
             .super__Head_base<0UL,_wabt::ExportModuleField_*,_false>._M_head_impl._4_4_;
  GetLocation(&local_100,this);
  Var::Var(&local_e0,index_00,&local_100);
  Var::operator=((Var *)(local_68 + 0x28),&local_e0);
  Var::~Var(&local_e0);
  *(ExternalKind *)(local_68 + 0x20) = kind;
  this_00 = this->module_;
  std::unique_ptr<wabt::ExportModuleField,_std::default_delete<wabt::ExportModuleField>_>::
  unique_ptr(&local_108,&local_40);
  Module::AppendField(this_00,&local_108);
  std::unique_ptr<wabt::ExportModuleField,_std::default_delete<wabt::ExportModuleField>_>::
  ~unique_ptr(&local_108);
  Result::Result((Result *)((long)&name_local.size_ + 4),Ok);
  std::unique_ptr<wabt::ExportModuleField,_std::default_delete<wabt::ExportModuleField>_>::
  ~unique_ptr(&local_40);
  return (Result)name_local.size_._4_4_;
}

Assistant:

Result BinaryReaderIR::OnExport(Index index,
                                ExternalKind kind,
                                Index item_index,
                                string_view name) {
  auto field = MakeUnique<ExportModuleField>(GetLocation());
  Export& export_ = field->export_;
  export_.name = name.to_string();
  switch (kind) {
    case ExternalKind::Func:
      assert(item_index < module_->funcs.size());
      break;
    case ExternalKind::Table:
      assert(item_index < module_->tables.size());
      break;
    case ExternalKind::Memory:
      assert(item_index < module_->memories.size());
      break;
    case ExternalKind::Global:
      assert(item_index < module_->globals.size());
      break;
    case ExternalKind::Except:
      // Note: Can't check if index valid, exceptions section comes later.
      break;
  }
  export_.var = Var(item_index, GetLocation());
  export_.kind = kind;
  module_->AppendField(std::move(field));
  return Result::Ok;
}